

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MethodGroup::init(MethodGroup *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  uint uVar2;
  ulong uVar3;
  TestCaseGroup *pTVar4;
  ulong extraout_RAX;
  Primitive primitive;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long lVar5;
  undefined1 auVar6 [16];
  string desc;
  string name;
  string local_70;
  string local_50;
  
  DVar1 = this->m_method;
  uVar2 = DVar1 - DRAWMETHOD_DRAWELEMENTS_BASEVERTEX;
  uVar3 = (ulong)uVar2;
  if (uVar2 < 3) {
    pTVar4 = (TestCaseGroup *)operator_new(0x80);
    TestCaseGroup::TestCaseGroup
              (pTVar4,(this->super_TestCaseGroup).m_context,"indices","Index tests");
    (pTVar4->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e59c50;
    *(DrawMethod *)&pTVar4[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = DVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
    pTVar4 = (TestCaseGroup *)operator_new(0x80);
    DVar1 = this->m_method;
    TestCaseGroup::TestCaseGroup
              (pTVar4,(this->super_TestCaseGroup).m_context,"base_vertex","Base vertex tests");
    (pTVar4->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e59ca0;
    *(DrawMethod *)&pTVar4[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = DVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
    pTVar4 = (TestCaseGroup *)operator_new(0x80);
    DVar1 = this->m_method;
    TestCaseGroup::TestCaseGroup
              (pTVar4,(this->super_TestCaseGroup).m_context,"builtin_variable",
               "Built in shader variable tests");
    (pTVar4->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e59cf0;
    *(DrawMethod *)&pTVar4[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = DVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
    uVar3 = extraout_RAX;
    in_RDX = extraout_RDX;
  }
  auVar6._8_8_ = in_RDX;
  auVar6._0_8_ = uVar3;
  for (lVar5 = 0; lVar5 != 0x1c; lVar5 = lVar5 + 4) {
    uVar2 = *(uint *)((long)&DAT_018da8d0 + lVar5);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              (&local_50,(DrawTestSpec *)(ulong)uVar2,auVar6._8_4_);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              (&local_70,(DrawTestSpec *)(ulong)uVar2,primitive);
    pTVar4 = (TestCaseGroup *)operator_new(0x88);
    DVar1 = this->m_method;
    TestCaseGroup::TestCaseGroup
              (pTVar4,(this->super_TestCaseGroup).m_context,local_50._M_dataplus._M_p,
               local_70._M_dataplus._M_p);
    (pTVar4->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e59d90;
    *(DrawMethod *)&pTVar4[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = DVar1;
    *(uint *)((long)&pTVar4[1].super_TestCaseGroup.super_TestNode._vptr_TestNode + 4) = uVar2;
    pTVar4[1].super_TestCaseGroup.super_TestNode.m_testCtx = (TestContext *)&DAT_100000001;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar4);
    std::__cxx11::string::~string((string *)&local_70);
    auVar6 = std::__cxx11::string::~string((string *)&local_50);
  }
  return auVar6._0_4_;
}

Assistant:

void MethodGroup::init (void)
{
	const bool indexed		=	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX)
							||	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX)
							||	(m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX);

	const gls::DrawTestSpec::Primitive primitive[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};

	if (indexed)
	{
		// Index-tests
		this->addChild(new IndexGroup(m_context, "indices", "Index tests", m_method));
		this->addChild(new BaseVertexGroup(m_context, "base_vertex", "Base vertex tests", m_method));
		this->addChild(new BuiltInVariableGroup(m_context, "builtin_variable", "Built in shader variable tests", m_method));
	}

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(primitive); ++ndx)
	{
		const std::string name = gls::DrawTestSpec::primitiveToString(primitive[ndx]);
		const std::string desc = gls::DrawTestSpec::primitiveToString(primitive[ndx]);

		this->addChild(new AttributeGroup(m_context, name.c_str(), desc.c_str(), m_method, primitive[ndx], gls::DrawTestSpec::INDEXTYPE_SHORT, gls::DrawTestSpec::STORAGE_BUFFER));
	}
}